

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemXP::ChnSetVol(SoundSystemXP *this,SoundChannel *chn)

{
  long *in_RSI;
  FmodError *in_RDI;
  undefined4 in_stack_fffffffffffffed0;
  int iVar1;
  float local_114;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator<char> local_c9;
  string *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  FMOD_RESULT in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  FmodError *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [144];
  
  if (*in_RSI != 0) {
    if (((*(byte *)((long)in_RSI + 0x14) & 1) == 0) &&
       ((in_RDI[1].sFile._M_string_length & 0x100000000) == 0)) {
      local_114 = *(float *)(in_RSI + 2) * *(float *)&in_RDI[1].sFile._M_string_length;
    }
    else {
      local_114 = 0.0;
    }
    gFmodRes = (*gpXPLMSetAudioVolume)(local_114,*in_RSI);
    if (gFmodRes != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(allocator<char> *)in_RDI);
      iVar1 = gFmodRes;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(allocator<char> *)in_RDI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(allocator<char> *)in_RDI);
      FmodError::FmodError
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
      FmodError::LogErr(in_RDI);
      FmodError::~FmodError((FmodError *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      std::allocator<char>::~allocator(&local_c9);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
    }
  }
  return;
}

Assistant:

void SoundSystemXP::ChnSetVol (const SoundChannel& chn)
{
    if (!chn.pChn) return;
    FMOD_LOG(gpXPLMSetAudioVolume(chn.pChn,
                                  chn.bMuted || bAllMuted ? 0.0f : (chn.vol * volMaster)));
}